

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O3

PeriodicTable_p indigox::PeriodicTable::GetInstance(void)

{
  PeriodicTable *__p;
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  PeriodicTable_p PVar3;
  
  std::__shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,instance_);
  _Var2._M_pi = extraout_RDX;
  if (*(element_type **)&(in_RDI->z_to_)._M_t._M_impl == (element_type *)0x0) {
    __p = (PeriodicTable *)operator_new(0x60);
    p_Var1 = &(__p->z_to_)._M_t._M_impl.super__Rb_tree_header;
    (__p->z_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->z_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (__p->z_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (__p->z_to_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__p->name_to_)._M_t._M_impl = 0;
    *(undefined8 *)&(__p->name_to_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    *(undefined8 *)&(__p->z_to_)._M_t._M_impl = 0;
    *(undefined8 *)&(__p->z_to_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (__p->z_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->z_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    p_Var1 = &(__p->name_to_)._M_t._M_impl.super__Rb_tree_header;
    (__p->name_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__p->name_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->name_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->name_to_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->name_to_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::__shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>::
    reset<indigox::PeriodicTable>
              ((__shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2> *)in_RDI,__p);
    GeneratePeriodicTable(*(PeriodicTable **)&(in_RDI->z_to_)._M_t._M_impl);
    instance_._0_8_ = *(undefined8 *)&(in_RDI->z_to_)._M_t._M_impl;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(instance_ + 8),
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(in_RDI->z_to_)._M_t._M_impl.super__Rb_tree_header);
    _Var2._M_pi = extraout_RDX_00;
  }
  PVar3.super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  PVar3.super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (PeriodicTable_p)
         PVar3.super___shared_ptr<indigox::PeriodicTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PeriodicTable_p PeriodicTable::GetInstance() {
    PeriodicTable_p instance = instance_.lock();
    if (!instance) {
      instance.reset(new PeriodicTable());
      instance->GeneratePeriodicTable();
      instance_ = instance;
    }
    return instance;
  }